

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O0

void swrenderer::rt_draw4cols(int sx)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint b;
  int local_24;
  uint local_20;
  int drawcount;
  uint minnexttop;
  uint minbot;
  uint maxtop;
  int bad;
  int x;
  int sx_local;
  
  for (maxtop = 0; (int)maxtop < 4; maxtop = maxtop + 1) {
    iVar1 = DCanvas::GetHeight((DCanvas *)screen);
    **(int **)(drawerargs::dc_ctspan + (long)(int)maxtop * 8) = iVar1 + 1;
    iVar1 = DCanvas::GetHeight((DCanvas *)screen);
    *(int *)(*(long *)(drawerargs::dc_ctspan + (long)(int)maxtop * 8) + 4) = iVar1;
  }
  do {
    while( true ) {
      minbot = 0;
      local_20 = 0xffffffff;
      for (maxtop = 0; (int)maxtop < 4; maxtop = maxtop + 1) {
        if ((&drawerargs::horizspan)[(int)maxtop] <
            *(ulong *)(drawerargs::dc_ctspan + (long)(int)maxtop * 8)) {
          if (*(uint *)((long)(&drawerargs::horizspan)[(int)maxtop] + 8) < local_20) {
            local_20 = *(uint *)((long)(&drawerargs::horizspan)[(int)maxtop] + 8);
          }
        }
        else {
          minbot = 1 << ((byte)maxtop & 0x1f) | minbot;
        }
      }
      if (minbot == 0xf) {
        return;
      }
      uVar2 = MAX<unsigned_int>(*drawerargs::horizspan,*DAT_00a66a98);
      uVar3 = MAX<unsigned_int>(*DAT_00a66aa0,*DAT_00a66aa8);
      uVar2 = MAX<unsigned_int>(uVar2,uVar3);
      uVar3 = MIN<unsigned_int>(drawerargs::horizspan[1],DAT_00a66a98[1]);
      b = MIN<unsigned_int>(DAT_00a66aa0[1],DAT_00a66aa8[1]);
      uVar3 = MIN<unsigned_int>(uVar3,b);
      if ((minbot != 0) || (uVar3 < uVar2)) break;
      for (maxtop = 0; (int)maxtop < 4; maxtop = maxtop + 1) {
        if (*(&drawerargs::horizspan)[(int)maxtop] < uVar2) {
          (*hcolfunc_post1)(maxtop,sx + maxtop,*(&drawerargs::horizspan)[(int)maxtop],uVar2 - 1);
        }
      }
      (*hcolfunc_post4)(sx,uVar2,uVar3);
      for (maxtop = 0; (int)maxtop < 4; maxtop = maxtop + 1) {
        if (uVar3 < *(uint *)((long)(&drawerargs::horizspan)[(int)maxtop] + 4)) {
          *(&drawerargs::horizspan)[(int)maxtop] = uVar3 + 1;
        }
        else {
          (&drawerargs::horizspan)[(int)maxtop] =
               (uint *)((long)(&drawerargs::horizspan)[(int)maxtop] + 8);
        }
      }
    }
    local_24 = 0;
    for (maxtop = 0; (int)maxtop < 4; maxtop = maxtop + 1) {
      if ((minbot & 1) == 0) {
        if (*(uint *)((long)(&drawerargs::horizspan)[(int)maxtop] + 4) < local_20) {
          (*hcolfunc_post1)(maxtop,sx + maxtop,*(&drawerargs::horizspan)[(int)maxtop],
                            *(undefined4 *)((long)(&drawerargs::horizspan)[(int)maxtop] + 4));
          (&drawerargs::horizspan)[(int)maxtop] =
               (uint *)((long)(&drawerargs::horizspan)[(int)maxtop] + 8);
          local_24 = local_24 + 1;
        }
        else if (*(&drawerargs::horizspan)[(int)maxtop] < local_20) {
          (*hcolfunc_post1)(maxtop,sx + maxtop,*(&drawerargs::horizspan)[(int)maxtop],local_20 - 1);
          *(&drawerargs::horizspan)[(int)maxtop] = local_20;
          local_24 = local_24 + 1;
        }
      }
      minbot = (int)minbot >> 1;
    }
  } while (local_24 != 0);
  return;
}

Assistant:

void rt_draw4cols(int sx)
	{
		using namespace drawerargs;

		int x, bad;
		unsigned int maxtop, minbot, minnexttop;

		// Place a dummy "span" in each column. These don't get
		// drawn. They're just here to avoid special cases in the
		// max/min calculations below.
		for (x = 0; x < 4; ++x)
		{
			dc_ctspan[x][0] = screen->GetHeight()+1;
			dc_ctspan[x][1] = screen->GetHeight();
		}

		for (;;)
		{
			// If a column is out of spans, mark it as such
			bad = 0;
			minnexttop = 0xffffffff;
			for (x = 0; x < 4; ++x)
			{
				if (horizspan[x] >= dc_ctspan[x])
				{
					bad |= 1 << x;
				}
				else if ((horizspan[x]+2)[0] < minnexttop)
				{
					minnexttop = (horizspan[x]+2)[0];
				}
			}
			// Once all columns are out of spans, we're done
			if (bad == 15)
			{
				return;
			}

			// Find the largest shared area for the spans in each column
			maxtop = MAX (MAX (horizspan[0][0], horizspan[1][0]),
						  MAX (horizspan[2][0], horizspan[3][0]));
			minbot = MIN (MIN (horizspan[0][1], horizspan[1][1]),
						  MIN (horizspan[2][1], horizspan[3][1]));

			// If there is no shared area with these spans, draw each span
			// individually and advance to the next spans until we reach a shared area.
			// However, only draw spans down to the highest span in the next set of
			// spans. If we allow the entire height of a span to be drawn, it could
			// prevent any more shared areas from being drawn in these four columns.
			//
			// Example: Suppose we have the following arrangement:
			//			A CD
			//			A CD
			//			 B D
			//			 B D
			//			aB D
			//			aBcD
			//			aBcD
			//			aBc
			//
			// If we draw the entire height of the spans, we end up drawing this first:
			//			A CD
			//			A CD
			//			 B D
			//			 B D
			//			 B D
			//			 B D
			//			 B D
			//			 B D
			//			 B
			//
			// This leaves only the "a" and "c" columns to be drawn, and they are not
			// part of a shared area, but if we can include B and D with them, we can
			// get a shared area. So we cut off everything in the first set just
			// above the "a" column and end up drawing this first:
			//			A CD
			//			A CD
			//			 B D
			//			 B D
			//
			// Then the next time through, we have the following arrangement with an
			// easily shared area to draw:
			//			aB D
			//			aBcD
			//			aBcD
			//			aBc
			if (bad != 0 || maxtop > minbot)
			{
				int drawcount = 0;
				for (x = 0; x < 4; ++x)
				{
					if (!(bad & 1))
					{
						if (horizspan[x][1] < minnexttop)
						{
							hcolfunc_post1 (x, sx+x, horizspan[x][0], horizspan[x][1]);
							horizspan[x] += 2;
							drawcount++;
						}
						else if (minnexttop > horizspan[x][0])
						{
							hcolfunc_post1 (x, sx+x, horizspan[x][0], minnexttop-1);
							horizspan[x][0] = minnexttop;
							drawcount++;
						}
					}
					bad >>= 1;
				}
				// Drawcount *should* always be non-zero. The reality is that some situations
				// can make this not true. Unfortunately, I'm not sure what those situations are.
				if (drawcount == 0)
				{
					return;
				}
				continue;
			}

			// Draw any span fragments above the shared area.
			for (x = 0; x < 4; ++x)
			{
				if (maxtop > horizspan[x][0])
				{
					hcolfunc_post1 (x, sx+x, horizspan[x][0], maxtop-1);
				}
			}

			// Draw the shared area.
			hcolfunc_post4 (sx, maxtop, minbot);

			// For each column, if part of the span is past the shared area,
			// set its top to just below the shared area. Otherwise, advance
			// to the next span in that column.
			for (x = 0; x < 4; ++x)
			{
				if (minbot < horizspan[x][1])
				{
					horizspan[x][0] = minbot+1;
				}
				else
				{
					horizspan[x] += 2;
				}
			}
		}
	}